

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

void __thiscall lrit::File::File(File *this,string *file)

{
  byte bVar1;
  char *pcVar2;
  int *piVar3;
  reference pvVar4;
  runtime_error *prVar5;
  string *in_RSI;
  string *in_RDI;
  string *this_00;
  ifstream ifs;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffc78;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffc80;
  undefined7 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffca0;
  int pos;
  Buffer *in_stack_fffffffffffffcb0;
  string local_2e0 [32];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  string local_2a0 [39];
  undefined1 local_279;
  char *local_278;
  undefined4 local_24c;
  string local_248 [48];
  long local_218 [5];
  char **in_stack_fffffffffffffe10;
  char (*in_stack_fffffffffffffe18) [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  char (*in_stack_fffffffffffffe28) [27];
  char (*in_stack_fffffffffffffe30) [87];
  char (*in_stack_fffffffffffffe38) [27];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2bf75c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2bf76f);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x2bf782)
  ;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_218,pcVar2,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
  if ((bVar1 & 1) != 0) {
    local_279 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_24c = 0x69;
    piVar3 = __errno_location();
    local_278 = strerror(*piVar3);
    util::str<char[16],std::__cxx11::string,char[3],char*>
              ((char (*) [16])in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
               in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    util::str<char[27],char[87],char[2],int,char[3],std::__cxx11::string>
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
               (char (*) [2])in_stack_fffffffffffffe28,(int *)in_stack_fffffffffffffe20,
               in_stack_fffffffffffffe18,in_stack_fffffffffffffe50);
    std::runtime_error::runtime_error(prVar5,local_248);
    local_279 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_fffffffffffffca0,CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98)
            );
  this_00 = in_RDI + 0x38;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  std::istream::read((char *)local_218,(long)pvVar4);
  pos = (int)((ulong)pvVar4 >> 0x20);
  bVar1 = std::ios::operator!((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    lrit::getHeader<lrit::PrimaryHeader>(in_stack_fffffffffffffcb0,pos);
    *(undefined8 *)(in_RDI + 0x90) = local_2b0;
    *(undefined8 *)(in_RDI + 0x80) = local_2c0;
    *(undefined8 *)(in_RDI + 0x88) = uStack_2b8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
               CONCAT17(bVar1,in_stack_fffffffffffffc98));
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x38),
                        0x10);
    std::istream::read((char *)local_218,(long)pvVar4);
    bVar1 = std::ios::operator!((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
    if ((bVar1 & 1) == 0) {
      lrit::getHeaderMap((Buffer *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::operator=
                (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 0x2bfc75);
      std::ifstream::~ifstream(local_218);
      return;
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    util::str<char[27],char[87],char[2],int>
              (in_stack_fffffffffffffe28,(char (*) [87])in_stack_fffffffffffffe20,
               (char (*) [2])in_stack_fffffffffffffe18,(int *)in_stack_fffffffffffffe10);
    std::runtime_error::runtime_error(prVar5,local_2e0);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  util::str<char[27],char[87],char[2],int>
            (in_stack_fffffffffffffe28,(char (*) [87])in_stack_fffffffffffffe20,
             (char (*) [2])in_stack_fffffffffffffe18,(int *)in_stack_fffffffffffffe10);
  std::runtime_error::runtime_error(prVar5,local_2a0);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

File::File(const std::string& file)
  : file_(file) {
  std::ifstream ifs(file_.c_str());
  ASSERTM(ifs, "Unable to open ", file_, ": ", strerror(errno));

  // First 16 bytes hold the primary header
  header_.resize(16);
  ifs.read(reinterpret_cast<char*>(&header_[0]), header_.size());
  ASSERT(ifs);

  // Parse primary header
  ph_ = lrit::getHeader<lrit::PrimaryHeader>(header_, 0);

  // Read remaining headers
  header_.resize(ph_.totalHeaderLength);
  ifs.read(reinterpret_cast<char*>(&header_[16]), ph_.totalHeaderLength - 16);
  ASSERT(ifs);

  // Build header map
  m_ = lrit::getHeaderMap(header_);
}